

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

Reader * __thiscall
capnp::MessageReader::getRootInternal(Reader *__return_storage_ptr__,MessageReader *this)

{
  uint64_t uVar1;
  SegmentReader *segment;
  Fault f;
  PointerReader local_30;
  
  if (this->allocatedArena == false) {
    capnp::_::ReaderArena::ReaderArena((ReaderArena *)this->arenaSpace,this);
    this->allocatedArena = true;
  }
  segment = capnp::_::ReaderArena::tryGetSegment((ReaderArena *)this->arenaSpace,(SegmentId)0x0);
  if ((segment != (SegmentReader *)0x0) && ((segment->ptr).size_ != 0)) {
    uVar1 = segment->readLimiter->limit;
    if (uVar1 != 0) {
      segment->readLimiter->limit = uVar1 - 1;
      capnp::_::PointerReader::getRoot
                (&local_30,segment,(CapTableReader *)&(anonymous_namespace)::dummyCapTableReader,
                 (segment->ptr).ptr,(this->options).nestingLimit);
      (__return_storage_ptr__->reader).pointer = local_30.pointer;
      (__return_storage_ptr__->reader).nestingLimit = local_30.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = local_30._28_4_;
      (__return_storage_ptr__->reader).segment = local_30.segment;
      (__return_storage_ptr__->reader).capTable = local_30.capTable;
      return __return_storage_ptr__;
    }
    (*segment->arena->_vptr_Arena[3])();
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0x60,FAILED,
             "segment != nullptr && segment->checkObject(segment->getStartPtr(), ONE * WORDS)",
             "\"Message did not contain a root pointer.\"",
             (char (*) [40])"Message did not contain a root pointer.");
  (__return_storage_ptr__->reader).pointer = (WirePointer *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->reader).nestingLimit = 0;
  (__return_storage_ptr__->reader).segment = (SegmentReader *)0x0;
  (__return_storage_ptr__->reader).capTable = (CapTableReader *)0x0;
  (__return_storage_ptr__->reader).nestingLimit = 0x7fffffff;
  kj::_::Debug::Fault::~Fault(&f);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader MessageReader::getRootInternal() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader* segment = arena()->tryGetSegment(_::SegmentId(0));
  KJ_REQUIRE(segment != nullptr &&
             segment->checkObject(segment->getStartPtr(), ONE * WORDS),
             "Message did not contain a root pointer.") {
    return AnyPointer::Reader();
  }

  // const_cast here is safe because dummyCapTableReader has no state.
  return AnyPointer::Reader(_::PointerReader::getRoot(
      segment, const_cast<DummyCapTableReader*>(&dummyCapTableReader),
      segment->getStartPtr(), options.nestingLimit));
}